

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::name_conflict_error::~name_conflict_error(name_conflict_error *this)

{
  name_conflict_error *this_local;
  
  *(undefined ***)this = &PTR__name_conflict_error_0082b690;
  std::__cxx11::string::~string((string *)&this->m_name);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~name_conflict_error() noexcept override = default;